

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::SourceCodeInfo_Location::SerializeWithCachedSizes
          (SourceCodeInfo_Location *this,CodedOutputStream *output)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  byte *pbVar1;
  string *psVar2;
  char *data;
  void *pvVar3;
  bool bVar4;
  int iVar5;
  uint *puVar6;
  Type *pTVar7;
  int iVar8;
  byte *pbVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  
  if (0 < (this->path_).current_size_) {
    if (output->buffer_size_ < 5) {
      io::CodedOutputStream::WriteVarint32SlowPath(output,10);
      iVar5 = output->buffer_size_;
    }
    else {
      *output->buffer_ = '\n';
      output->buffer_ = output->buffer_ + 1;
      iVar5 = output->buffer_size_ + -1;
      output->buffer_size_ = iVar5;
    }
    uVar12 = this->_path_cached_byte_size_;
    if (iVar5 < 5) {
      io::CodedOutputStream::WriteVarint32SlowPath(output,uVar12);
    }
    else {
      pbVar1 = output->buffer_;
      pbVar9 = pbVar1;
      uVar10 = uVar12;
      if (0x7f < uVar12) {
        do {
          *pbVar9 = (byte)uVar12 | 0x80;
          uVar10 = uVar12 >> 7;
          pbVar9 = pbVar9 + 1;
          bVar4 = 0x3fff < uVar12;
          uVar12 = uVar10;
        } while (bVar4);
      }
      *pbVar9 = (byte)uVar10;
      iVar5 = ((int)pbVar9 - (int)pbVar1) + 1;
      output->buffer_ = output->buffer_ + iVar5;
      output->buffer_size_ = output->buffer_size_ - iVar5;
    }
    iVar5 = (this->path_).current_size_;
    if (0 < iVar5) {
      iVar11 = 0;
      do {
        puVar6 = (uint *)RepeatedField<int>::Get(&this->path_,iVar11);
        uVar13 = (ulong)(int)*puVar6;
        if (output->buffer_size_ < 10) {
          io::CodedOutputStream::WriteVarint64SlowPath(output,uVar13);
        }
        else {
          pbVar1 = output->buffer_;
          pbVar9 = pbVar1;
          uVar14 = uVar13;
          if (0x7f < *puVar6) {
            do {
              *pbVar9 = (byte)uVar14 | 0x80;
              uVar13 = uVar14 >> 7;
              pbVar9 = pbVar9 + 1;
              bVar4 = 0x3fff < uVar14;
              uVar14 = uVar13;
            } while (bVar4);
          }
          *pbVar9 = (byte)uVar13;
          iVar8 = ((int)pbVar9 - (int)pbVar1) + 1;
          output->buffer_ = output->buffer_ + iVar8;
          output->buffer_size_ = output->buffer_size_ - iVar8;
        }
        iVar11 = iVar11 + 1;
      } while (iVar11 != iVar5);
    }
  }
  if (0 < (this->span_).current_size_) {
    if (output->buffer_size_ < 5) {
      io::CodedOutputStream::WriteVarint32SlowPath(output,0x12);
      iVar5 = output->buffer_size_;
    }
    else {
      *output->buffer_ = '\x12';
      output->buffer_ = output->buffer_ + 1;
      iVar5 = output->buffer_size_ + -1;
      output->buffer_size_ = iVar5;
    }
    uVar12 = this->_span_cached_byte_size_;
    if (iVar5 < 5) {
      io::CodedOutputStream::WriteVarint32SlowPath(output,uVar12);
    }
    else {
      pbVar1 = output->buffer_;
      pbVar9 = pbVar1;
      uVar10 = uVar12;
      if (0x7f < uVar12) {
        do {
          *pbVar9 = (byte)uVar12 | 0x80;
          uVar10 = uVar12 >> 7;
          pbVar9 = pbVar9 + 1;
          bVar4 = 0x3fff < uVar12;
          uVar12 = uVar10;
        } while (bVar4);
      }
      *pbVar9 = (byte)uVar10;
      iVar5 = ((int)pbVar9 - (int)pbVar1) + 1;
      output->buffer_ = output->buffer_ + iVar5;
      output->buffer_size_ = output->buffer_size_ - iVar5;
    }
    iVar5 = (this->span_).current_size_;
    if (0 < iVar5) {
      iVar11 = 0;
      do {
        puVar6 = (uint *)RepeatedField<int>::Get(&this->span_,iVar11);
        uVar13 = (ulong)(int)*puVar6;
        if (output->buffer_size_ < 10) {
          io::CodedOutputStream::WriteVarint64SlowPath(output,uVar13);
        }
        else {
          pbVar1 = output->buffer_;
          pbVar9 = pbVar1;
          uVar14 = uVar13;
          if (0x7f < *puVar6) {
            do {
              *pbVar9 = (byte)uVar14 | 0x80;
              uVar13 = uVar14 >> 7;
              pbVar9 = pbVar9 + 1;
              bVar4 = 0x3fff < uVar14;
              uVar14 = uVar13;
            } while (bVar4);
          }
          *pbVar9 = (byte)uVar13;
          iVar8 = ((int)pbVar9 - (int)pbVar1) + 1;
          output->buffer_ = output->buffer_ + iVar8;
          output->buffer_size_ = output->buffer_size_ - iVar8;
        }
        iVar11 = iVar11 + 1;
      } while (iVar11 != iVar5);
    }
  }
  uVar12 = (this->_has_bits_).has_bits_[0];
  if ((uVar12 & 1) != 0) {
    psVar2 = (this->leading_comments_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "google.protobuf.SourceCodeInfo.Location.leading_comments");
    internal::WireFormatLite::WriteStringMaybeAliased(3,(this->leading_comments_).ptr_,output);
  }
  if ((uVar12 & 2) != 0) {
    psVar2 = (this->trailing_comments_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "google.protobuf.SourceCodeInfo.Location.trailing_comments");
    internal::WireFormatLite::WriteStringMaybeAliased(4,(this->trailing_comments_).ptr_,output);
  }
  iVar5 = (this->leading_detached_comments_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < iVar5) {
    this_00 = &this->leading_detached_comments_;
    iVar11 = 0;
    do {
      pTVar7 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&this_00->super_RepeatedPtrFieldBase,iVar11);
      data = (pTVar7->_M_dataplus)._M_p;
      pTVar7 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&this_00->super_RepeatedPtrFieldBase,iVar11);
      internal::WireFormatLite::VerifyUtf8String
                (data,(int)pTVar7->_M_string_length,SERIALIZE,
                 "google.protobuf.SourceCodeInfo.Location.leading_detached_comments");
      pTVar7 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&this_00->super_RepeatedPtrFieldBase,iVar11);
      internal::WireFormatLite::WriteString(6,pTVar7,output);
      iVar11 = iVar11 + 1;
    } while (iVar5 != iVar11);
  }
  pvVar3 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    internal::WireFormat::SerializeUnknownFields
              ((UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe),output);
    return;
  }
  return;
}

Assistant:

void SourceCodeInfo_Location::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:google.protobuf.SourceCodeInfo.Location)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated int32 path = 1 [packed = true];
  if (this->path_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(1, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_path_cached_byte_size_);
  }
  for (int i = 0, n = this->path_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32NoTag(
      this->path(i), output);
  }

  // repeated int32 span = 2 [packed = true];
  if (this->span_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(2, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_span_cached_byte_size_);
  }
  for (int i = 0, n = this->span_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32NoTag(
      this->span(i), output);
  }

  cached_has_bits = _has_bits_[0];
  // optional string leading_comments = 3;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->leading_comments().data(), this->leading_comments().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.SourceCodeInfo.Location.leading_comments");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      3, this->leading_comments(), output);
  }

  // optional string trailing_comments = 4;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->trailing_comments().data(), this->trailing_comments().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.SourceCodeInfo.Location.trailing_comments");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      4, this->trailing_comments(), output);
  }

  // repeated string leading_detached_comments = 6;
  for (int i = 0, n = this->leading_detached_comments_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->leading_detached_comments(i).data(), this->leading_detached_comments(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.SourceCodeInfo.Location.leading_detached_comments");
    ::google::protobuf::internal::WireFormatLite::WriteString(
      6, this->leading_detached_comments(i), output);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
  // @@protoc_insertion_point(serialize_end:google.protobuf.SourceCodeInfo.Location)
}